

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

int testUTF8(int param_1,char **param_2)

{
  bool bVar1;
  test_utf8_char *local_40;
  test_utf8_char *c;
  test_utf8_entry *local_28;
  test_utf8_entry *e;
  int result;
  char **param_1_local;
  int param_0_local;
  
  e._4_4_ = 0;
  for (local_28 = good_entry; local_28->n != 0; local_28 = local_28 + 1) {
    bVar1 = decode_good(*local_28);
    if (!bVar1) {
      e._4_4_ = 1;
    }
  }
  for (local_40 = bad_chars; (*local_40)[0] != '\0'; local_40 = local_40 + 1) {
    bVar1 = decode_bad(*local_40);
    if (!bVar1) {
      e._4_4_ = 1;
    }
  }
  return e._4_4_;
}

Assistant:

int testUTF8(int, char*[])
{
  int result = 0;
  for(test_utf8_entry const* e = good_entry; e->n; ++e)
    {
    if(!decode_good(*e))
      {
      result = 1;
      }
    }
  for(test_utf8_char const* c = bad_chars; (*c)[0]; ++c)
    {
    if(!decode_bad(*c))
      {
      result = 1;
      }
    }
  return result;
}